

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

void luaD_throw(lua_State *L,int errcode)

{
  ushort uVar1;
  lua_longjmp *plVar2;
  global_State *pgVar3;
  lua_State *plVar4;
  int *piVar5;
  StkId pTVar6;
  StkId pTVar7;
  GCObject *pGVar8;
  int errcode_00;
  
  plVar2 = L->errorJmp;
  if (plVar2 != (lua_longjmp *)0x0) {
    plVar2->status = errcode;
    _longjmp((__jmp_buf_tag *)plVar2->b,1);
  }
  pgVar3 = L->l_G;
  errcode_00 = luaF_close(L,L->stack,errcode);
  L->status = (lu_byte)errcode_00;
  plVar4 = pgVar3->mainthread;
  if (plVar4->errorJmp == (lua_longjmp *)0x0) {
    if (pgVar3->panic != (lua_CFunction)0x0) {
      luaD_seterrorobj(L,errcode_00,L->top);
      if (L->ci->top < L->top) {
        L->ci->top = L->top;
      }
      piVar5 = *(int **)&L[-1].hookmask;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 != 0) {
        __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x8e,"void luaD_throw(lua_State *, int)");
      }
      (*pgVar3->panic)(L);
    }
    abort();
  }
  pTVar6 = plVar4->top;
  plVar4->top = pTVar6 + 1;
  pTVar7 = L->top;
  pGVar8 = pTVar7[-1].value_.gc;
  (pTVar6->value_).gc = pGVar8;
  uVar1 = pTVar7[-1].tt_;
  pTVar6->tt_ = uVar1;
  if (((short)uVar1 < 0) &&
     (((uVar1 & 0x7f) != (ushort)pGVar8->tt ||
      ((pGVar8->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x86,"void luaD_throw(lua_State *, int)");
  }
  luaD_throw(pgVar3->mainthread,errcode_00);
}

Assistant:

l_noret luaD_throw (lua_State *L, int errcode) {
  if (L->errorJmp) {  /* thread has an error handler? */
    L->errorJmp->status = errcode;  /* set status */
    LUAI_THROW(L, L->errorJmp);  /* jump to it */
  }
  else {  /* thread has no error handler */
    global_State *g = G(L);
#ifdef RAVI_DEFER_STATEMENT
    errcode = luaF_close(L, L->stack, errcode);  /* close all upvalues */
#endif
    L->status = cast_byte(errcode);  /* mark it as dead */
    if (g->mainthread->errorJmp) {  /* main thread has a handler? */
      setobjs2s(L, g->mainthread->top++, L->top - 1);  /* copy error obj. */
      luaD_throw(g->mainthread, errcode);  /* re-throw in main thread */
    }
    else {  /* no handler at all; abort */
      if (g->panic) {  /* panic function? */
        luaD_seterrorobj(L, errcode, L->top);  /* assume EXTRA_STACK */
        if (L->ci->top < L->top)
          L->ci->top = L->top;  /* pushing msg. can break this invariant */
        lua_unlock(L);
        g->panic(L);  /* call panic function (last chance to jump out) */
      }
      abort();
    }
  }
}